

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  uint *puVar1;
  uint uVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  type_conflict5 tVar6;
  ulong uVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  ulong uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  DataKey local_150;
  ulong local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = (pSVar3->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (pSVar3->thecovectors->set).thenum;
  uVar9 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar9;
  }
  local_148 = 0xffffffffffffffff;
  lVar8 = 0x30;
  local_150.info = 0;
  local_150.idx = 0;
  local_140 = best;
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    local_188.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar8 + -0x10);
    puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar8 + -0x30);
    local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_188.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar8 + -0x20);
    local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_188.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_188.m_backend.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar8 + -8);
    local_188.m_backend.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar8 + -4);
    local_188.m_backend._48_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar8);
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (tol->m_backend).exp;
    result.m_backend.neg = (tol->m_backend).neg;
    result.m_backend.fpclass = (tol->m_backend).fpclass;
    result.m_backend.prec_elem = (tol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar6 = boost::multiprecision::operator<(&local_188,&result);
    if (tVar6) {
      local_68 = (steeppr  [8])local_188.m_backend.data._M_elems._0_8_;
      auStack_60[0] = local_188.m_backend.data._M_elems[2];
      auStack_60[1] = local_188.m_backend.data._M_elems[3];
      local_58[0] = local_188.m_backend.data._M_elems[4];
      local_58[1] = local_188.m_backend.data._M_elems[5];
      auStack_50[0] = local_188.m_backend.data._M_elems[6];
      auStack_50[1] = local_188.m_backend.data._M_elems[7];
      local_48[0] = local_188.m_backend.data._M_elems[8];
      local_48[1] = local_188.m_backend.data._M_elems[9];
      local_40 = local_188.m_backend.exp;
      local_3c = local_188.m_backend.neg;
      local_38 = local_188.m_backend.fpclass;
      iStack_34 = local_188.m_backend.prec_elem;
      puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar8 + -0x30);
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar5->m_backend).data + lVar8 + -0x20);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar8 + -0x10);
      local_a8.m_backend.exp = *(int *)((long)&(pnVar5->m_backend).data + lVar8 + -8);
      local_a8.m_backend.neg = *(bool *)((long)&(pnVar5->m_backend).data + lVar8 + -4);
      local_a8.m_backend._48_8_ = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar8);
      local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_e8.m_backend.exp = (tol->m_backend).exp;
      local_e8.m_backend.neg = (tol->m_backend).neg;
      local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
      local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_68,&local_a8,&local_e8,in_R8);
      local_188.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
      local_188.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
      local_188.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_188.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_188.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      local_188.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
      local_188.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_188.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_188.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_188.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_188.m_backend.exp = result.m_backend.exp;
      local_188.m_backend.neg = result.m_backend.neg;
      local_188.m_backend.fpclass = result.m_backend.fpclass;
      local_188.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar6 = boost::multiprecision::operator>(&local_188,local_140);
      if (tVar6) {
        *(undefined8 *)((local_140->m_backend).data._M_elems + 8) =
             local_188.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((local_140->m_backend).data._M_elems + 4) =
             local_188.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((local_140->m_backend).data._M_elems + 6) =
             local_188.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(local_140->m_backend).data._M_elems =
             local_188.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((local_140->m_backend).data._M_elems + 2) =
             local_188.m_backend.data._M_elems._8_8_;
        (local_140->m_backend).exp = local_188.m_backend.exp;
        (local_140->m_backend).neg = local_188.m_backend.neg;
        (local_140->m_backend).fpclass = local_188.m_backend.fpclass;
        (local_140->m_backend).prec_elem = local_188.m_backend.prec_elem;
        local_150 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::coId((this->
                                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).thesolver,(int)uVar9);
        local_148 = (ulong)local_150 >> 0x20;
      }
    }
    lVar8 = lVar8 + 0x38;
  }
  return (SPxId)((ulong)local_150 & 0xffffffff | local_148 << 0x20);
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}